

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  char *in_RCX;
  int in_EDX;
  int family;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  FILE *__stream;
  int in_ESI;
  int line;
  char *__format;
  undefined4 uVar5;
  nn_thread thread;
  
  sb = test_socket_impl((char *)0x37,in_ESI,in_EDX,(int)in_RCX);
  line = 0x102178;
  iVar2 = nn_bind(sb);
  __stream = _stderr;
  if (iVar2 < 0) {
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    uVar1 = *puVar3;
    uVar5 = 0x38;
    __format = "Failed bind to \"%s\": %s [%d] (%s:%d)\n";
  }
  else {
    sc = test_socket_impl((char *)0x39,line,family,(int)in_RCX);
    iVar2 = nn_connect(sc,"inproc://a");
    __stream = _stderr;
    if (-1 < iVar2) {
      nn_thread_init(&thread,worker,(void *)0x0);
      test_recv_impl((char *)0x3e,sb,sock,in_RCX);
      test_recv_impl((char *)0x3f,sb,sock_00,in_RCX);
      nn_thread_term(&thread);
      test_close_impl((char *)0x43,sc,sock_01);
      test_close_impl((char *)0x44,sb,sock_02);
      return 0;
    }
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    uVar1 = *puVar3;
    uVar5 = 0x3a;
    __format = "Failed connect to \"%s\": %s [%d] (%s:%d)\n";
  }
  fprintf(__stream,__format,"inproc://a",pcVar4,(ulong)uVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c",
          uVar5);
  nn_err_abort();
}

Assistant:

int main ()
{
    struct nn_thread thread;

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    nn_thread_init (&thread, worker, NULL);

    test_recv (sb, "ABC");
    test_recv (sb, "ABC");

    nn_thread_term (&thread);

    test_close (sc);
    test_close (sb);

    return 0;
}